

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

void __thiscall
CLOptions::AddVersionInfo
          (CLOptions *this,string *text_to_be_printed,string *param_name,string *param_descrip)

{
  char cVar1;
  long lVar2;
  CLString *this_00;
  string version_opt_desc;
  allocator local_6a;
  allocator local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"version",&local_69);
  }
  else {
    std::__cxx11::string::string((string *)&local_68,(string *)param_name);
  }
  std::__cxx11::string::operator=((string *)&this->version_str,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (lVar2 == 0) {
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_69);
  }
  cVar1 = std::__cxx11::string::empty();
  if (cVar1 == '\0') {
    std::__cxx11::string::string((string *)&local_68,(string *)param_descrip);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_68,"Print version information and exit.",&local_6a);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_6a);
  }
  this_00 = &this->version_opt;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setParamName(&this_00->
                super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ,&this->version_str);
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDescription(&this_00->
                  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ,&local_68);
  std::__cxx11::string::string((string *)&local_48,(string *)text_to_be_printed);
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setValue(&this_00->
            super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void AddVersionInfo(const std::string& text_to_be_printed = "version text not set",
                        const std::string& param_name = "",
                        const std::string& param_descrip = "")
    {
        // Set the name of the parameter
        version_str = (param_name.size() > 0) ? param_name : "version" ;
        std::string version_opt_desc = (param_descrip.empty()) ? "Print version information and exit." : param_descrip ;
        
        // Set the actual parameter
        version_opt.setParamName(version_str) ;
        version_opt.setDescription(version_opt_desc) ;
        version_opt.setValue(text_to_be_printed) ;
    }